

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Gia_Man_t * Gia_ManDupMuxes(Gia_Man_t *p,int Limit)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  uint *puVar10;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  long lVar15;
  Gia_Obj_t *pGVar16;
  Gia_Obj_t *pGVar17;
  long lVar18;
  long lVar19;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_48;
  Gia_Obj_t *local_40;
  int local_38;
  int local_34;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x67,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (Limit < 0) {
    __assert_fail("Limit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x68,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  iVar5 = p_00->nObjsAlloc;
  local_34 = Limit;
  puVar10 = (uint *)calloc((long)iVar5,4);
  p_00->pMuxes = puVar10;
  if (p->pSibls != (int *)0x0) {
    piVar11 = (int *)calloc((long)iVar5,4);
    p_00->pSibls = piVar11;
  }
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_00);
  if (1 < p->nObjs) {
    lVar15 = 0x100000000;
    lVar19 = 1;
    lVar18 = 0;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)(&pGVar3[1].field_0x0 + lVar18);
      uVar6 = (uint)uVar4;
      if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar16 = p_00->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar12)) goto LAB_0021d094;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * -0x55555555);
        pGVar16 = p_00->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar12)) goto LAB_0021d094;
        iVar5 = (int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * 0x55555556;
      }
      else {
        iVar5 = (int)(uVar4 & 0x1fffffff);
        if ((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar6) {
          if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
             ((uVar6 & 0x1fffffff) != ((uint)(uVar4 >> 0x20) & 0x1fffffff))) {
            pGVar16 = (Gia_Obj_t *)(&pGVar3[1].field_0x0 + lVar18);
            iVar5 = Gia_ObjIsMuxType(pGVar16);
            if ((iVar5 == 0) ||
               ((piVar11 = p->pSibls, piVar11 != (int *)0x0 &&
                ((*(int *)((long)piVar11 +
                          ((long)((ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff) * -0x100000000
                                 + lVar15) >> 0x1e)) != 0 ||
                 ((piVar11 != (int *)0x0 &&
                  (*(int *)((long)piVar11 +
                           ((long)((ulong)((uint)((ulong)*(undefined8 *)pGVar16 >> 0x20) &
                                          0x1fffffff) * -0x100000000 + lVar15) >> 0x1e)) != 0)))))))
               ) {
              uVar4 = *(ulong *)(&pGVar3[1].field_0x0 + lVar18);
              uVar6 = *(uint *)((long)pGVar3 +
                               (ulong)(((uint)uVar4 & 0x1fffffff) << 2) * -3 + lVar18 + 0x14);
              if (((int)uVar6 < 0) ||
                 (uVar14 = *(uint *)((long)pGVar3 +
                                    lVar18 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + 0x14
                                    ), (int)uVar14 < 0)) goto LAB_0021d0f1;
              iVar5 = Gia_ManHashAnd(p_00,(uint)(uVar4 >> 0x1d) & 1 ^ uVar6,
                                     uVar14 ^ (uint)(uVar4 >> 0x3d) & 1);
            }
            else {
              iVar5 = Gia_ObjRecognizeExor(pGVar16,&local_40,&local_48);
              pGVar12 = p->pObjs;
              if (iVar5 == 0) {
                uVar6 = (uint)*(undefined8 *)(&pGVar3[1].field_0x0 + lVar18) & 0x1fffffff;
                pGVar17 = (Gia_Obj_t *)((long)pGVar16 + (ulong)(uVar6 * 4) * -3);
                if ((pGVar17 < pGVar12) || (pGVar12 + p->nObjs <= pGVar17)) goto LAB_0021d094;
                uVar14 = (uint)((ulong)*(undefined8 *)(&pGVar3[1].field_0x0 + lVar18) >> 0x20) &
                         0x1fffffff;
                pGVar17 = (Gia_Obj_t *)((long)pGVar3 + lVar18 + (ulong)(uVar14 * 4) * -3 + 0xc);
                if ((pGVar17 < pGVar12) || (pGVar12 + p->nObjs <= pGVar17)) goto LAB_0021d094;
                if (local_34 <
                    p->pRefs[(int)((long)pGVar3 +
                                   lVar18 + ((ulong)(uVar14 << 2) * -3 - (long)pGVar12) + 0xc >> 2)
                             * -0x55555555] +
                    p->pRefs[(int)((long)pGVar3 +
                                   lVar18 + ((ulong)(uVar6 << 2) * -3 - (long)pGVar12) + 0xc >> 2) *
                             -0x55555555]) {
                  iVar5 = Gia_ObjFanin0Copy(pGVar16);
                  iVar7 = Gia_ObjFanin1Copy(pGVar16);
                  iVar5 = Gia_ManHashAnd(p_00,iVar5,iVar7);
                }
                else {
                  pGVar16 = Gia_ObjRecognizeMux(pGVar16,&local_48,&local_40);
                  iVar5 = Gia_ObjToLit(p,pGVar16);
                  iVar5 = Gia_ObjLitCopy(p,iVar5);
                  iVar7 = Gia_ObjToLit(p,local_48);
                  local_38 = Gia_ObjLitCopy(p,iVar7);
                  iVar7 = Gia_ObjToLit(p,local_40);
                  iVar7 = Gia_ObjLitCopy(p,iVar7);
                  iVar5 = Gia_ManHashMuxReal(p_00,iVar5,local_38,iVar7);
                }
              }
              else {
                pGVar16 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
                if (pGVar16 < pGVar12) goto LAB_0021d094;
                iVar5 = p->nObjs;
                if (pGVar12 + iVar5 <= pGVar16) goto LAB_0021d094;
                uVar6 = (int)((long)pGVar16 - (long)pGVar12 >> 2) * -0x55555555;
                if ((int)uVar6 < 0) {
LAB_0021d14e:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                if (iVar5 <= (int)uVar6) goto LAB_0021d0b3;
                if ((int)pGVar12[uVar6 & 0x7fffffff].Value < 0) goto LAB_0021d0f1;
                pGVar16 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
                if ((pGVar16 < pGVar12) || (pGVar12 + iVar5 <= pGVar16)) goto LAB_0021d094;
                uVar14 = (int)((long)pGVar16 - (long)pGVar12 >> 2) * -0x55555555;
                if ((int)uVar14 < 0) goto LAB_0021d14e;
                if (iVar5 <= (int)uVar14) goto LAB_0021d0b3;
                if ((int)pGVar12[uVar14 & 0x7fffffff].Value < 0) goto LAB_0021d0f1;
                iVar5 = Gia_ManHashXorReal(p_00,pGVar12[uVar6 & 0x7fffffff].Value ^
                                                (uint)local_40 & 1,
                                           pGVar12[uVar14 & 0x7fffffff].Value ^ (uint)local_48 & 1);
              }
            }
          }
          else {
            uVar14 = *(uint *)((long)pGVar3 + lVar18 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
            if ((int)uVar14 < 0) goto LAB_0021d0f1;
            iVar5 = Gia_ManAppendBuf(p_00,uVar14 ^ uVar6 >> 0x1d & 1);
          }
        }
        else {
          uVar14 = *(uint *)((long)pGVar3 + lVar18 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
          if ((int)uVar14 < 0) {
LAB_0021d0f1:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar5 = Gia_ManAppendCo(p_00,uVar14 ^ uVar6 >> 0x1d & 1);
        }
      }
      *(int *)((long)&pGVar3[1].Value + lVar18) = iVar5;
      piVar11 = p->pSibls;
      if ((piVar11 != (int *)0x0) && (piVar11[lVar19] != 0)) {
        uVar6 = *(uint *)((long)&pGVar3[1].Value + lVar18);
        if ((int)uVar6 < 0) {
LAB_0021d0d2:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar6 = uVar6 >> 1;
        iVar5 = p_00->nObjs;
        if (iVar5 <= (int)uVar6) {
LAB_0021d0b3:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        iVar7 = piVar11[lVar19];
        if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0021d0b3;
        uVar14 = p->pObjs[iVar7].Value;
        if ((int)uVar14 < 0) goto LAB_0021d0d2;
        uVar14 = uVar14 >> 1;
        if (iVar5 <= (int)uVar14) goto LAB_0021d0b3;
        uVar1 = *(uint *)(p_00->pObjs + uVar6);
        if (((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) &&
           (uVar1 = *(uint *)(p_00->pObjs + uVar14), (~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1))
        {
          if ((iVar5 <= (int)uVar6) || (iVar5 <= (int)uVar14)) {
LAB_0021d094:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (uVar14 < uVar6) {
            p_00->pSibls[uVar6] = uVar14;
          }
        }
      }
      lVar19 = lVar19 + 1;
      lVar15 = lVar15 + 0x100000000;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxes( Gia_Man_t * p, int Limit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC, * pSiblNew, * pObjNew;
    int i;
    assert( p->pMuxes == NULL );
    assert( Limit >= 0 ); // allows to create AIG with XORs without MUXes
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !Gia_ObjIsMuxType(pObj) || Gia_ObjSibl(p, Gia_ObjFaninId0(pObj, i)) || Gia_ObjSibl(p, Gia_ObjFaninId1(pObj, i)) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)) );
        else if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) + Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > Limit )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
        if ( !Gia_ObjSibl(p, i) )
            continue;
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        pSiblNew = Gia_ManObj( pNew, Abc_Lit2Var(Gia_ObjSiblObj(p, i)->Value) );
        if ( Gia_ObjIsAnd(pObjNew) && Gia_ObjIsAnd(pSiblNew) && Gia_ObjId(pNew, pObjNew) > Gia_ObjId(pNew, pSiblNew) )
            pNew->pSibls[Gia_ObjId(pNew, pObjNew)] = Gia_ObjId(pNew, pSiblNew);
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}